

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O0

int Gia_ManCountTents(Gia_Man_t *p)

{
  int iVar1;
  int iObj_00;
  Vec_Int_t *p_00;
  bool bVar2;
  int local_30;
  int nSizePrev;
  int nSizeCurr;
  int iObj;
  int i;
  int t;
  Gia_Obj_t *pObj;
  Vec_Int_t *vRoots;
  Gia_Man_t *p_local;
  
  local_30 = 0;
  iVar1 = Gia_ManPoNum(p);
  if (iVar1 < 1) {
    __assert_fail("Gia_ManPoNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                  ,0x113,"int Gia_ManCountTents(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrentId(p,0);
  p_00 = Vec_IntAlloc(100);
  nSizeCurr = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar2 = false;
    if (nSizeCurr < iVar1) {
      _i = Gia_ManCo(p,nSizeCurr);
      bVar2 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjFaninId0p(p,_i);
    Vec_IntPush(p_00,iVar1);
    nSizeCurr = nSizeCurr + 1;
  }
  iObj = 0;
  while (iVar1 = Vec_IntSize(p_00), local_30 < iVar1) {
    iVar1 = Vec_IntSize(p_00);
    for (nSizeCurr = local_30; nSizeCurr < iVar1; nSizeCurr = nSizeCurr + 1) {
      iObj_00 = Vec_IntEntry(p_00,nSizeCurr);
      Gia_ManCountTents_rec(p,iObj_00,p_00);
    }
    iObj = iObj + 1;
    local_30 = iVar1;
  }
  Vec_IntFree(p_00);
  return iObj;
}

Assistant:

int Gia_ManCountTents( Gia_Man_t * p )
{
    Vec_Int_t * vRoots;
    Gia_Obj_t * pObj;  
    int t, i, iObj, nSizeCurr = 0;
    assert( Gia_ManPoNum(p) > 0 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    vRoots = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( p, pObj, i )
        Vec_IntPush( vRoots, Gia_ObjFaninId0p(p, pObj) );
    for ( t = 0; nSizeCurr < Vec_IntSize(vRoots); t++ )
    {
        int nSizePrev = nSizeCurr;
        nSizeCurr = Vec_IntSize(vRoots);
        Vec_IntForEachEntryStartStop( vRoots, iObj, i, nSizePrev, nSizeCurr )
            Gia_ManCountTents_rec( p, iObj, vRoots );
    }
    Vec_IntFree( vRoots );
    return t;
}